

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::CharacterNode::deleteValues(CharacterNode *this,UObjectDeleter *valueDeleter)

{
  UObjectDeleter *valueDeleter_local;
  CharacterNode *this_local;
  
  if (this->fValues != (void *)0x0) {
    if (this->fHasValuesVector == '\0') {
      if (valueDeleter != (UObjectDeleter *)0x0) {
        (*valueDeleter)(this->fValues);
      }
    }
    else if ((long *)this->fValues != (long *)0x0) {
      (**(code **)(*this->fValues + 8))();
    }
  }
  return;
}

Assistant:

void CharacterNode::deleteValues(UObjectDeleter *valueDeleter) {
    if (fValues == NULL) {
        // Do nothing.
    } else if (!fHasValuesVector) {
        if (valueDeleter) {
            valueDeleter(fValues);
        }
    } else {
        delete (UVector *)fValues;
    }
}